

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

LClosure * luaU_undump(lua_State *L,ZIO *Z,char *name)

{
  StkId pTVar1;
  byte bVar2;
  LClosure *pLVar3;
  Proto *pPVar4;
  LClosure *x_;
  TValue *io;
  LClosure *cl;
  LoadState S;
  char *name_local;
  ZIO *Z_local;
  lua_State *L_local;
  
  if ((*name == '@') || (*name == '=')) {
    S.Z = (ZIO *)(name + 1);
  }
  else {
    S.Z = (ZIO *)name;
    if (*name == '\x1b') {
      S.Z = (ZIO *)anon_var_dwarf_14c39;
    }
  }
  cl = (LClosure *)L;
  S.L = (lua_State *)Z;
  S.name = name;
  checkHeader((LoadState *)&cl);
  bVar2 = LoadByte((LoadState *)&cl);
  pLVar3 = luaF_newLclosure(L,(uint)bVar2);
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)pLVar3;
  pTVar1->tt_ = 0x46;
  luaD_inctop(L);
  pPVar4 = luaF_newproto(L);
  pLVar3->p = pPVar4;
  LoadFunction((LoadState *)&cl,pLVar3->p,(TString *)0x0);
  return pLVar3;
}

Assistant:

LClosure *luaU_undump(lua_State *L, ZIO *Z, const char *name) {
  LoadState S;
  LClosure *cl;
  if (*name == '@' || *name == '=')
    S.name = name + 1;
  else if (*name == LUA_SIGNATURE[0])
    S.name = "binary string";
  else
    S.name = name;
  S.L = L;
  S.Z = Z;
  checkHeader(&S);
  cl = luaF_newLclosure(L, LoadByte(&S));
  setclLvalue(L, L->top, cl);
  luaD_inctop(L);
  cl->p = luaF_newproto(L);
  LoadFunction(&S, cl->p, NULL);
  lua_assert(cl->nupvalues == cl->p->sizeupvalues);
  luai_verifycode(L, buff, cl->p);
  return cl;
}